

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O1

unsigned_long __thiscall
dlib::thread_pool_implementation::num_threads_in_pool(thread_pool_implementation *this)

{
  unsigned_long uVar1;
  auto_mutex M;
  auto_mutex local_28;
  
  local_28.m = &this->m;
  local_28.r = (rmutex *)0x0;
  local_28.rw = (read_write_mutex *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)local_28.m);
  uVar1 = (this->tasks).array_size;
  auto_mutex::unlock(&local_28);
  return uVar1;
}

Assistant:

unsigned long thread_pool_implementation::
    num_threads_in_pool (
    ) const
    {
        auto_mutex M(m);
        return tasks.size();
    }